

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void count_nonweapon_abilities(artifact *art,artifact_set_data *data)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  wchar_t wVar7;
  object_kind *poVar8;
  wchar_t bonus;
  wchar_t to_a;
  wchar_t to_dam;
  wchar_t to_hit;
  object_kind *kind;
  artifact_set_data *data_local;
  artifact *art_local;
  
  poVar8 = lookup_kind(art->tval,art->sval);
  iVar3 = art->to_h;
  iVar2 = randcalc(poVar8->to_h,0,MINIMISE);
  iVar3 = iVar3 - iVar2;
  iVar2 = art->to_d;
  iVar4 = randcalc(poVar8->to_d,0,MINIMISE);
  iVar2 = iVar2 - iVar4;
  iVar4 = art->to_a;
  iVar5 = randcalc(poVar8->to_a,0,MINIMISE);
  uVar6 = ((iVar4 - iVar5) - data->ac_startval) / data->ac_increment;
  if (0 < (int)uVar6) {
    if (art->to_a < 0x15) {
      if (art->tval == 10) {
        file_putf(log_file,"Adding %d for AC bonus - boots\n",(ulong)uVar6);
        data->art_probs[0x17] = uVar6 + data->art_probs[0x17];
      }
      else if (art->tval == 0xb) {
        file_putf(log_file,"Adding %d for AC bonus - gloves\n",(ulong)uVar6);
        data->art_probs[0x1d] = uVar6 + data->art_probs[0x1d];
      }
      else if ((art->tval == 0xc) || (art->tval == 0xd)) {
        file_putf(log_file,"Adding %d for AC bonus - hat\n",(ulong)uVar6);
        data->art_probs[0x21] = uVar6 + data->art_probs[0x21];
      }
      else if (art->tval == 0xe) {
        file_putf(log_file,"Adding %d for AC bonus - shield\n",(ulong)uVar6);
        data->art_probs[0x27] = uVar6 + data->art_probs[0x27];
      }
      else if (art->tval == 0xf) {
        file_putf(log_file,"Adding %d for AC bonus - cloak\n",(ulong)uVar6);
        data->art_probs[0x29] = uVar6 + data->art_probs[0x29];
      }
      else if (((art->tval == 0x10) || (art->tval == 0x11)) || (art->tval == 0x12)) {
        file_putf(log_file,"Adding %d for AC bonus - body armor\n",(ulong)uVar6);
        data->art_probs[0x2b] = uVar6 + data->art_probs[0x2b];
      }
      else {
        file_putf(log_file,"Adding %d for AC bonus - general\n",(ulong)uVar6);
        data->art_probs[0x4e] = uVar6 + data->art_probs[0x4e];
      }
    }
    else {
      file_putf(log_file,"Adding %d for supercharged AC\n",(ulong)uVar6);
      data->art_probs[0x5d] = data->art_probs[0x5d] + 1;
    }
  }
  if ((iVar3 < 1) || (iVar2 < 1)) {
    if (iVar3 < 1) {
      if ((0 < iVar2) && (uVar6 = iVar2 / data->dam_increment, 0 < (int)uVar6)) {
        file_putf(log_file,"Adding %d instances of extra to-dam bonus for non-weapon\n",(ulong)uVar6
                 );
        data->art_probs[7] = uVar6 + data->art_probs[7];
      }
    }
    else {
      uVar6 = iVar3 / data->hit_increment;
      if (0 < (int)uVar6) {
        file_putf(log_file,"Adding %d instances of extra to-hit bonus for non-weapon\n",(ulong)uVar6
                 );
        data->art_probs[6] = uVar6 + data->art_probs[6];
      }
    }
  }
  else {
    uVar6 = (iVar3 + iVar2) / (data->hit_increment + data->dam_increment);
    if (0 < (int)uVar6) {
      if (art->tval == 0xb) {
        file_putf(log_file,"Adding %d instances of extra to-hit and to-dam bonus for gloves\n",
                  (ulong)uVar6);
        data->art_probs[0x20] = uVar6 + data->art_probs[0x20];
      }
      else {
        file_putf(log_file,"Adding %d instances of extra to-hit and to-dam bonus for non-weapon\n",
                  (ulong)uVar6);
        data->art_probs[8] = uVar6 + data->art_probs[8];
      }
    }
  }
  if (art->weight != poVar8->weight) {
    file_putf(log_file,"Adding 1 for unusual weight.\n");
    data->art_probs[0x16] = data->art_probs[0x16] + 1;
  }
  _Var1 = flag_has_dbg(art->flags,5,0x1a,"art->flags","OF_AGGRAVATE");
  if (_Var1) {
    file_putf(log_file,"Adding 1 for aggravation - nonweapon\n");
    data->art_probs[0x56] = data->art_probs[0x56] + 1;
  }
  if (art->slays != (_Bool *)0x0) {
    wVar7 = slay_count(art->slays);
    data->art_probs[10] = wVar7 + data->art_probs[10];
    file_putf(log_file,"Adding %d for slays\n",(ulong)(uint)wVar7);
  }
  if (art->brands != (_Bool *)0x0) {
    wVar7 = brand_count(art->brands);
    data->art_probs[9] = wVar7 + data->art_probs[9];
    file_putf(log_file,"Adding %d for brands\n",(ulong)(uint)wVar7);
  }
  if (0 < art->modifiers[10]) {
    file_putf(log_file,"Adding 1 for extra blows on nonweapon\n");
    data->art_probs[0xb] = data->art_probs[0xb] + 1;
  }
  if (0 < art->modifiers[0xb]) {
    file_putf(log_file,"Adding 1 for extra shots on nonweapon\n");
    data->art_probs[0xc] = data->art_probs[0xc] + 1;
  }
  if (0 < art->modifiers[8]) {
    file_putf(log_file,"Adding 1 for tunnelling bonus - general.\n");
    data->art_probs[0x4f] = data->art_probs[0x4f] + 1;
  }
  return;
}

Assistant:

static void count_nonweapon_abilities(const struct artifact *art,
							   struct artifact_set_data *data)
{
	struct object_kind *kind = lookup_kind(art->tval, art->sval);
	int to_hit = art->to_h - randcalc(kind->to_h, 0, MINIMISE);
	int to_dam = art->to_d - randcalc(kind->to_d, 0, MINIMISE);
	int to_a = art->to_a - randcalc(kind->to_a, 0, MINIMISE)
		- data->ac_startval;
	int bonus = to_a / data->ac_increment;

	/* Armor class */
	if (bonus > 0) {
		if (art->to_a > 20) {
			file_putf(log_file, "Adding %d for supercharged AC\n", bonus);
			(data->art_probs[ART_IDX_GEN_AC_SUPER])++;
		} else if (art->tval == TV_BOOTS) {
			file_putf(log_file, "Adding %d for AC bonus - boots\n", bonus);
			(data->art_probs[ART_IDX_BOOT_AC]) += bonus;
		} else if (art->tval == TV_GLOVES) {
			file_putf(log_file, "Adding %d for AC bonus - gloves\n", bonus);
			(data->art_probs[ART_IDX_GLOVE_AC]) += bonus;
		} else if (art->tval == TV_HELM || art->tval == TV_CROWN) {
			file_putf(log_file, "Adding %d for AC bonus - hat\n", bonus);
			(data->art_probs[ART_IDX_HELM_AC]) += bonus;
		} else if (art->tval == TV_SHIELD) {
			file_putf(log_file, "Adding %d for AC bonus - shield\n", bonus);
			(data->art_probs[ART_IDX_SHIELD_AC]) += bonus;
		} else if (art->tval == TV_CLOAK) {
			file_putf(log_file, "Adding %d for AC bonus - cloak\n", bonus);
			(data->art_probs[ART_IDX_CLOAK_AC]) += bonus;
		} else if (art->tval == TV_SOFT_ARMOR ||
				   art->tval == TV_HARD_ARMOR ||
				   art->tval == TV_DRAG_ARMOR) {
			file_putf(log_file, "Adding %d for AC bonus - body armor\n", bonus);
			(data->art_probs[ART_IDX_ARMOR_AC]) += bonus;
		} else {
			file_putf(log_file, "Adding %d for AC bonus - general\n", bonus);
			(data->art_probs[ART_IDX_GEN_AC]) += bonus;
		}
	}

	/* To hit and dam to bonuses */
	if ((to_hit > 0) && (to_dam > 0)) {
		bonus = (to_hit + to_dam) / (data->hit_increment + data->dam_increment);
		if (bonus > 0) {
			if (art->tval == TV_GLOVES) {
				file_putf(log_file, "Adding %d instances of extra to-hit and to-dam bonus for gloves\n", bonus);
				(data->art_probs[ART_IDX_GLOVE_HIT_DAM]) += bonus;
			} else {
				file_putf(log_file, "Adding %d instances of extra to-hit and to-dam bonus for non-weapon\n", bonus);
				(data->art_probs[ART_IDX_NONWEAPON_HIT_DAM]) += bonus;
			}
		}
	} else if (to_hit > 0) {
		bonus = to_hit / data->hit_increment;
		if (bonus > 0) {
			file_putf(log_file, "Adding %d instances of extra to-hit bonus for non-weapon\n", bonus);
			(data->art_probs[ART_IDX_NONWEAPON_HIT]) += bonus;
		}
	} else if (to_dam > 0) {
		bonus = to_dam / data->dam_increment;
		if (bonus > 0) {
			file_putf(log_file, "Adding %d instances of extra to-dam bonus for non-weapon\n", bonus);
			(data->art_probs[ART_IDX_NONWEAPON_DAM]) += bonus;
		}
	}

	/* Check weight - is it different from normal? */
	if (art->weight != kind->weight) {
		file_putf(log_file, "Adding 1 for unusual weight.\n");
		(data->art_probs[ART_IDX_ALLARMOR_WEIGHT])++;
	}

	/* Aggravation */
	if (of_has(art->flags, OF_AGGRAVATE)) {
		file_putf(log_file, "Adding 1 for aggravation - nonweapon\n");
		(data->art_probs[ART_IDX_NONWEAPON_AGGR])++;
	}

	/* Count brands and slays */
	if (art->slays) {
		bonus = slay_count(art->slays);
		data->art_probs[ART_IDX_NONWEAPON_SLAY] += bonus;
		file_putf(log_file, "Adding %d for slays\n", bonus);
	}
	if (art->brands) {
		bonus = brand_count(art->brands);
		data->art_probs[ART_IDX_NONWEAPON_BRAND] += bonus;
		file_putf(log_file, "Adding %d for brands\n", bonus);
	}

	/* Blows */
	if (art->modifiers[OBJ_MOD_BLOWS] > 0) {
		file_putf(log_file, "Adding 1 for extra blows on nonweapon\n");
		(data->art_probs[ART_IDX_NONWEAPON_BLOWS])++;
	}

	/* Shots */
	if (art->modifiers[OBJ_MOD_SHOTS] > 0) {
		file_putf(log_file, "Adding 1 for extra shots on nonweapon\n");
		(data->art_probs[ART_IDX_NONWEAPON_SHOTS])++;
	}

	/* Check for tunnelling ability */
	if (art->modifiers[OBJ_MOD_TUNNEL] > 0) {
		file_putf(log_file, "Adding 1 for tunnelling bonus - general.\n");
		(data->art_probs[ART_IDX_GEN_TUNN])++;
	}
}